

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

AttributeSpecSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AttributeSpecSyntax,slang::syntax::AttributeSpecSyntax_const&>
          (BumpAllocator *this,AttributeSpecSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  EqualsValueClauseSyntax *pEVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  AttributeSpecSyntax *pAVar10;
  
  pAVar10 = (AttributeSpecSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((AttributeSpecSyntax *)this->endPtr < pAVar10 + 1) {
    pAVar10 = (AttributeSpecSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pAVar10 + 1);
  }
  SVar8 = (args->super_SyntaxNode).kind;
  uVar9 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar4 = (args->name).kind;
  uVar5 = (args->name).field_0x2;
  NVar6.raw = (args->name).numFlags.raw;
  uVar7 = (args->name).rawLen;
  pEVar3 = args->value;
  (pAVar10->name).info = (args->name).info;
  pAVar10->value = pEVar3;
  (pAVar10->super_SyntaxNode).previewNode = pSVar2;
  (pAVar10->name).kind = TVar4;
  (pAVar10->name).field_0x2 = uVar5;
  (pAVar10->name).numFlags = (NumericTokenFlags)NVar6.raw;
  (pAVar10->name).rawLen = uVar7;
  (pAVar10->super_SyntaxNode).kind = SVar8;
  *(undefined4 *)&(pAVar10->super_SyntaxNode).field_0x4 = uVar9;
  (pAVar10->super_SyntaxNode).parent = pSVar1;
  return pAVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }